

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O0

void glist_write(_glist *x,t_symbol *filename,t_symbol *format)

{
  int iVar1;
  _glist *x_00;
  _glist *canvas;
  char buf [1000];
  _binbuf *b;
  int cr;
  t_symbol *format_local;
  t_symbol *filename_local;
  _glist *x_local;
  
  b._4_4_ = 0;
  x_00 = glist_getcanvas(x);
  canvas_makefilename(x_00,filename->s_name,(char *)&canvas,1000);
  iVar1 = strcmp(format->s_name,"cr");
  if (iVar1 == 0) {
    b._4_4_ = 1;
  }
  else if (*format->s_name != '\0') {
    pd_error((void *)0x0,"qlist_read: unknown flag: %s",format->s_name);
  }
  buf._992_8_ = glist_writetobinbuf(x,1);
  if ((_binbuf *)buf._992_8_ != (_binbuf *)0x0) {
    iVar1 = binbuf_write((_binbuf *)buf._992_8_,(char *)&canvas,"",b._4_4_);
    if (iVar1 != 0) {
      pd_error((void *)0x0,"%s: write failed",filename->s_name);
    }
    binbuf_free((_binbuf *)buf._992_8_);
  }
  return;
}

Assistant:

static void glist_write(t_glist *x, t_symbol *filename, t_symbol *format)
{
    int cr = 0;
    t_binbuf *b;
    char buf[MAXPDSTRING];
    t_canvas *canvas = glist_getcanvas(x);
    canvas_makefilename(canvas, filename->s_name, buf, MAXPDSTRING);
    if (!strcmp(format->s_name, "cr"))
        cr = 1;
    else if (*format->s_name)
        pd_error(0, "qlist_read: unknown flag: %s", format->s_name);

    b = glist_writetobinbuf(x, 1);
    if (b)
    {
        if (binbuf_write(b, buf, "", cr))
            pd_error(0, "%s: write failed", filename->s_name);
        binbuf_free(b);
    }
}